

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

double r_exec::View::MorphValue(double value,double source_thr,double destination_thr)

{
  double local_30;
  double r;
  double destination_thr_local;
  double source_thr_local;
  double value_local;
  
  if ((value != 0.0) || (value_local = destination_thr, NAN(value))) {
    if (source_thr <= 0.0) {
      value_local = destination_thr + value;
    }
    else {
      value_local = value;
      if (0.0 < destination_thr) {
        local_30 = (value * destination_thr) / source_thr;
        if (1.0 < local_30) {
          local_30 = 1.0;
        }
        value_local = local_30;
      }
    }
  }
  return value_local;
}

Assistant:

double View::MorphValue(double value, double source_thr, double destination_thr)
{
    if (value == 0) {
        return destination_thr;
    }

    if (source_thr > 0) {
        if (destination_thr > 0) {
            double r = value * destination_thr / source_thr;

            if (r > 1) { // handles precision errors.
                r = 1;
            }

            return r;
        } else {
            return value;
        }
    }

    return destination_thr + value;
}